

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<false,true,false>
          (BeagleCPU4StateSSEImpl<double,2,0> *this,double *outDerivatives,double *outSumDerivatives
          ,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  long lVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  
  dVar4 = 0.0;
  dVar6 = 0.0;
  for (lVar3 = 0; lVar3 < (long)*(int *)(this + 0x14) + -1; lVar3 = lVar3 + 2) {
    auVar5 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(this + 0x100) + lVar3 * 8),
                        *(undefined1 (*) [16])(*(long *)(this + 0xf8) + lVar3 * 8));
    pdVar1 = (double *)(*(long *)(this + 0x80) + lVar3 * 8);
    dVar4 = dVar4 + auVar5._0_8_ * *pdVar1;
    dVar6 = dVar6 + auVar5._8_8_ * pdVar1[1];
  }
  auVar5._0_8_ = dVar4 + dVar6;
  auVar5._8_8_ = dVar4 + dVar6;
  for (; lVar3 < *(int *)(this + 0x14); lVar3 = lVar3 + 1) {
    auVar7._0_8_ = *(double *)(*(long *)(this + 0x100) + lVar3 * 8) /
                   *(double *)(*(long *)(this + 0xf8) + lVar3 * 8);
    auVar7._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(*(long *)(this + 0x80) + lVar3 * 8);
    auVar5 = vfmadd231sd_fma(auVar5,auVar7,auVar2);
  }
  *outSumDerivatives = auVar5._0_8_;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}